

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Matchers::StdString::RegexMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,RegexMatcher *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char *__rhs;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  RegexMatcher *local_18;
  RegexMatcher *this_local;
  
  local_18 = this;
  this_local = (RegexMatcher *)__return_storage_ptr__;
  Detail::stringify<std::__cxx11::string>(&local_58,(Detail *)&this->m_regex,in_RDX);
  std::operator+(&local_38,"matches ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58);
  __rhs = " case insensitively";
  if (this->m_caseSensitivity == Yes) {
    __rhs = " case sensitively";
  }
  std::operator+(__return_storage_ptr__,&local_38,__rhs);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string RegexMatcher::describe() const {
            return "matches " + ::Catch::Detail::stringify(m_regex) + ((m_caseSensitivity == CaseSensitive::Choice::Yes)? " case sensitively" : " case insensitively");
        }